

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

void __thiscall
leveldb::anon_unknown_1::PosixEnv::StartThread
          (PosixEnv *this,_func_void_void_ptr *thread_main,void *thread_main_arg)

{
  long in_FS_OFFSET;
  thread new_thread;
  thread tStack_28;
  void *local_20;
  _func_void_void_ptr *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = thread_main_arg;
  local_18 = thread_main;
  std::thread::thread<void(*&)(void*),void*&,void>(&tStack_28,&local_18,&local_20);
  std::thread::detach();
  std::thread::~thread(&tStack_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void StartThread(void (*thread_main)(void* thread_main_arg),
                   void* thread_main_arg) override {
    std::thread new_thread(thread_main, thread_main_arg);
    new_thread.detach();
  }